

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

LineInterpolationMethod
tcu::verifyLineGroupInterpolation
          (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  bool bVar1;
  MessageBuilder *this;
  MessageBuilder local_1b8;
  undefined1 local_32;
  undefined1 local_31;
  bool isNarrow;
  TestLog *pTStack_30;
  bool multisampled;
  TestLog *log_local;
  RasterizationArguments *args_local;
  LineSceneSpec *scene_local;
  Surface *surface_local;
  
  local_31 = args->numSamples != 0;
  pTStack_30 = log;
  log_local = (TestLog *)args;
  args_local = (RasterizationArguments *)scene;
  scene_local = (LineSceneSpec *)surface;
  if ((bool)local_31) {
    bVar1 = anon_unknown_3::verifyMultisampleLineGroupInterpolation(surface,scene,args,log);
    if (bVar1) {
      surface_local._4_4_ = LINEINTERPOLATION_STRICTLY_CORRECT;
    }
    else {
      surface_local._4_4_ = LINEINTERPOLATION_INCORRECT;
    }
  }
  else {
    local_32 = scene->lineWidth == 1.0;
    if ((bool)local_32) {
      bVar1 = anon_unknown_3::verifySinglesampleNarrowLineGroupInterpolation(surface,scene,args,log)
      ;
      if (bVar1) {
        return LINEINTERPOLATION_STRICTLY_CORRECT;
      }
    }
    else {
      bVar1 = anon_unknown_3::verifySinglesampleWideLineGroupInterpolation(surface,scene,args,log);
      if (bVar1) {
        return LINEINTERPOLATION_STRICTLY_CORRECT;
      }
    }
    TestLog::operator<<(&local_1b8,pTStack_30,(BeginMessageToken *)&TestLog::Message);
    this = MessageBuilder::operator<<
                     (&local_1b8,
                      (char (*) [85])
                      "Accurate verification failed, checking with projected weights (inaccurate equation)."
                     );
    MessageBuilder::operator<<(this,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_1b8);
    bVar1 = anon_unknown_3::verifyLineGroupInterpolationWithProjectedWeights
                      ((Surface *)scene_local,(LineSceneSpec *)args_local,
                       (RasterizationArguments *)log_local,pTStack_30);
    if (bVar1) {
      surface_local._4_4_ = LINEINTERPOLATION_PROJECTED;
    }
    else {
      surface_local._4_4_ = LINEINTERPOLATION_INCORRECT;
    }
  }
  return surface_local._4_4_;
}

Assistant:

LineInterpolationMethod verifyLineGroupInterpolation (const tcu::Surface& surface, const LineSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	const bool multisampled = args.numSamples != 0;

	if (multisampled)
	{
		if (verifyMultisampleLineGroupInterpolation(surface, scene, args, log))
			return LINEINTERPOLATION_STRICTLY_CORRECT;
		return LINEINTERPOLATION_INCORRECT;
	}
	else
	{
		const bool isNarrow = (scene.lineWidth == 1.0f);

		// accurate interpolation
		if (isNarrow)
		{
			if (verifySinglesampleNarrowLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}
		else
		{
			if (verifySinglesampleWideLineGroupInterpolation(surface, scene, args, log))
				return LINEINTERPOLATION_STRICTLY_CORRECT;
		}

		// check with projected (inaccurate) interpolation
		log << tcu::TestLog::Message << "Accurate verification failed, checking with projected weights (inaccurate equation)." << tcu::TestLog::EndMessage;
		if (verifyLineGroupInterpolationWithProjectedWeights(surface, scene, args, log))
			return LINEINTERPOLATION_PROJECTED;

		return LINEINTERPOLATION_INCORRECT;
	}
}